

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Type TVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  GeneratorOptions *pGVar4;
  long *plVar5;
  string *psVar6;
  size_type *psVar7;
  int i;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  char *pcVar8;
  BytesMode in_R8D;
  BytesMode BVar9;
  undefined1 in_R9B;
  undefined1 drop_list;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  SimpleItoa_abi_cxx11_(&local_b0,(protobuf *)(ulong)*(uint *)(field + 0x38),(int)printer);
  io::Printer::Print(printer,"    case $num$:\n","num",&local_b0);
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    psVar6 = &local_b0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (psVar6,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
               in_R8D,(bool)in_R9B);
    io::Printer::Print(printer,
                       "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
                       ,"name",psVar6);
    pGVar4 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      pGVar4 = extraout_RDX_00;
    }
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)this_00,pGVar4,(FieldDescriptor *)psVar6);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)this_01,options_00,(FieldDescriptor *)psVar6);
    psVar6 = &local_b0;
    io::Printer::Print(printer,
                       "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$"
                       ,"keyReaderFn",psVar6,"valueReaderFn",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    TVar3 = FieldDescriptor::type(this_01);
    if (TVar3 == TYPE_MESSAGE) {
      pGVar4 = (GeneratorOptions *)FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_b0,(_anonymous_namespace_ *)options,pGVar4,(Descriptor *)psVar6);
      io::Printer::Print(printer,", $messageType$.deserializeBinaryFromReader","messageType",
                         &local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    io::Printer::Print(printer,");\n");
    io::Printer::Print(printer,"         });\n");
    goto LAB_00227d1e;
  }
  BVar9 = 0x227b22;
  TVar3 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
    TVar3 = FieldDescriptor::type(field);
    pcVar8 = "Message";
    if (TVar3 == TYPE_GROUP) {
      pcVar8 = "Group";
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar8,pcVar8 + (ulong)(TVar3 != TYPE_GROUP) * 2 + 5);
    TVar3 = FieldDescriptor::type(field);
    if (TVar3 == TYPE_GROUP) {
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_70.field_2._M_allocated_capacity = *psVar7;
        local_70.field_2._8_8_ = plVar5[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar7;
        local_70._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    }
    BVar9 = 0x35aa24;
    psVar6 = &local_90;
    io::Printer::Print(printer,
                       "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
                       ,"fieldclass",&local_b0,"msgOrGroup",psVar6,"grpfield",&local_70);
    drop_list = SUB81(psVar6,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((TVar3 == TYPE_GROUP) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_00227c4f:
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,true,true,true,BVar9);
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,bVar2);
    BVar9 = 0x38163e;
    psVar6 = &local_90;
    io::Printer::Print(printer,
                       "      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n",
                       "fieldtype",&local_b0,"reader",psVar6);
    drop_list = SUB81(psVar6,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00227c4f;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((*(int *)(field + 0x4c) != 3) || (bVar2 = FieldDescriptor::is_packed(field), bVar2)) {
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar9,(bool)drop_list);
    io::Printer::Print(printer,"      msg.set$name$(value);\n","name",&local_b0);
  }
  else {
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x1,BVar9,(bool)drop_list);
    io::Printer::Print(printer,"      msg.add$name$(value);\n","name",&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_00227d1e:
  io::Printer::Print(printer,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {

  printer->Print("    case $num$:\n",
                 "num", SimpleItoa(field->number()));

  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print("        jspb.Map.deserializeBinary(message, reader, "
                   "$keyReaderFn$, $valueReaderFn$",
          "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
          "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
          "messageType", GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
        "fieldclass", SubmessageTypeRef(options, field),
          "msgOrGroup", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                        "Group" : "Message",
          "grpfield", (field->type() == FieldDescriptor::TYPE_GROUP) ?
                      (SimpleItoa(field->number()) + ", ") : "");
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype", JSFieldTypeAnnotation(options, field, false, true,
                                             /* singular_if_not_packed */ true,
                                             BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_repeated() && !field->is_packed()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print(
          "      msg.set$name$(value);\n",
          "name", JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}